

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_ubo_reference.cpp
# Opt level: O2

ir_visitor_status __thiscall
anon_unknown.dwarf_78949::lower_ubo_reference_visitor::visit_enter
          (lower_ubo_reference_visitor *this,ir_call *ir)

{
  exec_list *this_00;
  byte bVar1;
  ir_node_type iVar2;
  ir_intrinsic_id iVar3;
  ir_function_signature *piVar4;
  ir_instruction *piVar5;
  glsl_interface_packing packing;
  uint uVar6;
  uint uVar7;
  int iVar8;
  glsl_interface_packing gVar9;
  ir_visitor_status iVar10;
  long lVar11;
  undefined4 extraout_var;
  void *pvVar12;
  operand b;
  ir_expression *piVar13;
  undefined4 extraout_var_00;
  ir_variable *piVar14;
  glsl_type *type;
  ir_function_signature *this_01;
  ir_function *this_02;
  undefined4 extraout_var_01;
  ir_call *this_03;
  exec_node *peVar15;
  exec_node *peVar16;
  exec_node *peVar17;
  exec_node **ppeVar18;
  ir_rvalue *piVar19;
  bool row_major;
  void *local_f8;
  uint local_f0;
  uint const_offset;
  ir_rvalue *local_e8;
  exec_list sig_params;
  glsl_type *matrix_type;
  exec_list local_a0;
  ir_rvalue *offset;
  char func_name [64];
  
  this_00 = &ir->actual_parameters;
  uVar6 = exec_list::length(this_00);
  if ((1 < uVar6) && (uVar6 = exec_list::length(this_00), uVar6 < 4)) {
    peVar16 = (ir->actual_parameters).head_sentinel.next;
    peVar17 = &(ir->actual_parameters).tail_sentinel;
    peVar15 = (exec_node *)0x0;
    if (peVar16 != peVar17) {
      peVar15 = peVar16;
    }
    if ((((*(uint *)&peVar15[1].next < 7) &&
         (lVar11 = (*(code *)peVar15[-1].prev[4].next)(&peVar15[-1].prev), lVar11 != 0)) &&
        ((*(uint *)(lVar11 + 0x40) & 0xf000) == 0x2000)) &&
       ((*(long *)(lVar11 + 0x88) != 0 &&
        (ir->callee->intrinsic_id - ir_intrinsic_generic_atomic_add < 8)))) {
      local_f0 = exec_list::length(this_00);
      if ((local_f0 & 0xfffffffe) != 2) {
        __assert_fail("param_count == 2 || param_count == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                      ,0x3c2,
                      "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                     );
      }
      peVar16 = (this_00->head_sentinel).next;
      peVar15 = (exec_node *)0x0;
      if (peVar16 != peVar17) {
        peVar15 = peVar16;
      }
      piVar19 = (ir_rvalue *)&peVar15[-1].prev;
      if (peVar15 == (exec_node *)0x0) {
        piVar19 = (ir_rvalue *)0x0;
      }
      iVar2 = (piVar19->super_ir_instruction).ir_type;
      if ((ir_type_swizzle < iVar2) ||
         ((0x27U >> (iVar2 & (ir_type_precision|ir_type_return)) & 1) == 0)) {
        __assert_fail("inst->ir_type == ir_type_dereference_variable || inst->ir_type == ir_type_dereference_array || inst->ir_type == ir_type_dereference_record || inst->ir_type == ir_type_swizzle"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                      ,0x3ca,
                      "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                     );
      }
      if (piVar19->type->vector_elements == '\x01') {
        uVar6 = *(uint *)&piVar19->type->field_0x4;
        uVar7 = uVar6 & 0xfe;
        if ((uVar7 < 0xe) && ((uVar6 & 0xff) == 2 || uVar7 == 0)) {
          iVar8 = (*(piVar19->super_ir_instruction)._vptr_ir_instruction[8])(piVar19);
          piVar14 = (ir_variable *)CONCAT44(extraout_var,iVar8);
          if (piVar14 == (ir_variable *)0x0) {
            __assert_fail("var",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                          ,0x3d1,
                          "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                         );
          }
          pvVar12 = ralloc_parent(this->shader->ir);
          offset = (ir_rvalue *)0x0;
          bVar1 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
                  super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.field_0x31;
          gVar9 = *(uint *)&piVar14->interface_type->field_0x4 >> 0x16 &
                  GLSL_INTERFACE_PACKING_STD430;
          packing = (uint)bVar1 + (uint)bVar1 * 2;
          if (gVar9 == GLSL_INTERFACE_PACKING_STD430) {
            packing = gVar9;
          }
          if (gVar9 == GLSL_INTERFACE_PACKING_STD140) {
            packing = gVar9;
          }
          *(undefined4 *)
           &(this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
            super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.field_0x34 = 4;
          this->variable = piVar14;
          local_e8 = piVar19;
          setup_for_load_or_store
                    (this,pvVar12,piVar14,piVar19,&offset,&const_offset,&row_major,&matrix_type,
                     packing);
          piVar19 = offset;
          if (offset == (ir_rvalue *)0x0) {
            __assert_fail("offset",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                          ,1000,
                          "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                         );
          }
          if (row_major == true) {
            __assert_fail("!row_major",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                          ,0x3e9,
                          "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                         );
          }
          if (matrix_type != (glsl_type *)0x0) {
            __assert_fail("matrix_type == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                          ,0x3ea,
                          "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                         );
          }
          b.val = (ir_rvalue *)exec_node::operator_new(0xb0,pvVar12);
          local_f8 = pvVar12;
          ir_constant::ir_constant((ir_constant *)b.val,const_offset,1);
          piVar13 = ir_builder::add((operand)piVar19,b);
          pvVar12 = local_f8;
          iVar8 = (*(this->uniform_block->super_ir_instruction)._vptr_ir_instruction[4])
                            (this->uniform_block,local_f8,0);
          sig_params.head_sentinel.next = &sig_params.tail_sentinel;
          sig_params.head_sentinel.prev = (exec_node *)0x0;
          sig_params.tail_sentinel.next = (exec_node *)0x0;
          sig_params.tail_sentinel.prev = &sig_params.head_sentinel;
          piVar14 = (ir_variable *)exec_node::operator_new(0x90,pvVar12);
          ir_variable::ir_variable(piVar14,&glsl_type::_uint_type,"block_ref",ir_var_function_in);
          peVar17 = &(piVar14->super_ir_instruction).super_exec_node;
          (piVar14->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
          (piVar14->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
          (sig_params.tail_sentinel.prev)->next = peVar17;
          sig_params.tail_sentinel.prev = peVar17;
          piVar14 = (ir_variable *)exec_node::operator_new(0x90,pvVar12);
          ir_variable::ir_variable(piVar14,&glsl_type::_uint_type,"offset",ir_var_function_in);
          peVar17 = &(piVar14->super_ir_instruction).super_exec_node;
          (piVar14->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
          (piVar14->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
          (sig_params.tail_sentinel.prev)->next = peVar17;
          sig_params.tail_sentinel.prev = peVar17;
          type = glsl_type::get_scalar_type(local_e8->type);
          piVar14 = (ir_variable *)exec_node::operator_new(0x90,pvVar12);
          ir_variable::ir_variable(piVar14,type,"data1",ir_var_function_in);
          peVar17 = &(piVar14->super_ir_instruction).super_exec_node;
          (piVar14->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
          (piVar14->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
          (sig_params.tail_sentinel.prev)->next = peVar17;
          sig_params.tail_sentinel.prev = peVar17;
          if (local_f0 == 3) {
            piVar14 = (ir_variable *)exec_node::operator_new(0x90,local_f8);
            ir_variable::ir_variable(piVar14,type,"data2",ir_var_function_in);
            peVar17 = &(piVar14->super_ir_instruction).super_exec_node;
            (piVar14->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
            (piVar14->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
            (sig_params.tail_sentinel.prev)->next = peVar17;
            sig_params.tail_sentinel.prev = peVar17;
          }
          pvVar12 = local_f8;
          this_01 = (ir_function_signature *)exec_node::operator_new(0x88,local_f8);
          ir_function_signature::ir_function_signature
                    (this_01,local_e8->type,shader_storage_buffer_object);
          ir_function_signature::replace_parameters(this_01,&sig_params);
          piVar4 = ir->callee;
          iVar3 = piVar4->intrinsic_id;
          if ((int)iVar3 < 1) {
            __assert_fail("ir->callee->intrinsic_id >= ir_intrinsic_generic_load",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                          ,0x40d,
                          "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                         );
          }
          if (ir_intrinsic_generic_atomic_comp_swap < iVar3) {
            __assert_fail("ir->callee->intrinsic_id <= ir_intrinsic_generic_atomic_comp_swap",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                          ,0x40e,
                          "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                         );
          }
          this_01->intrinsic_id = iVar3 + ir_intrinsic_image_atomic_dec_wrap;
          sprintf(func_name,"%s_ssbo",piVar4->_function->name);
          this_02 = (ir_function *)exec_node::operator_new(0x60,pvVar12);
          ir_function::ir_function(this_02,func_name);
          this_01->_function = this_02;
          peVar16 = &(this_01->super_ir_instruction).super_exec_node;
          (this_01->super_ir_instruction).super_exec_node.next =
               &(this_02->signatures).tail_sentinel;
          peVar17 = (this_02->signatures).tail_sentinel.prev;
          (this_01->super_ir_instruction).super_exec_node.prev = peVar17;
          peVar17->next = peVar16;
          (this_02->signatures).tail_sentinel.prev = peVar16;
          local_a0.head_sentinel.next = (exec_node *)(CONCAT44(extraout_var_00,iVar8) + 8);
          if (CONCAT44(extraout_var_00,iVar8) == 0) {
            local_a0.head_sentinel.next = (exec_node *)0x0;
          }
          local_a0.head_sentinel.prev = (exec_node *)0x0;
          local_a0.tail_sentinel.next = (exec_node *)0x0;
          (local_a0.head_sentinel.next)->prev = &local_a0.head_sentinel;
          local_a0.tail_sentinel.prev =
               &(piVar13->super_ir_rvalue).super_ir_instruction.super_exec_node;
          if (piVar13 == (ir_expression *)0x0) {
            local_a0.tail_sentinel.prev = (exec_node *)0x0;
          }
          (local_a0.tail_sentinel.prev)->next = &local_a0.tail_sentinel;
          (local_a0.tail_sentinel.prev)->prev = local_a0.head_sentinel.next;
          (local_a0.head_sentinel.next)->next = local_a0.tail_sentinel.prev;
          peVar17 = ((this_00->head_sentinel).next)->next;
          ppeVar18 = &peVar17[-1].prev;
          if (6 < *(uint *)&peVar17[1].next) {
            ppeVar18 = (exec_node **)0x0;
          }
          lVar11 = (*(code *)(*ppeVar18)[2].next)(ppeVar18,local_f8,0);
          pvVar12 = local_f8;
          peVar16 = (exec_node *)(lVar11 + 8);
          if (lVar11 == 0) {
            peVar16 = (exec_node *)0x0;
          }
          peVar16->next = &local_a0.tail_sentinel;
          peVar16->prev = local_a0.tail_sentinel.prev;
          (local_a0.tail_sentinel.prev)->next = peVar16;
          local_a0.tail_sentinel.prev = peVar16;
          if (local_f0 == 3) {
            ppeVar18 = &peVar17->next[-1].prev;
            if (6 < *(uint *)&peVar17->next[1].next) {
              ppeVar18 = (exec_node **)0x0;
            }
            lVar11 = (*(code *)(*ppeVar18)[2].next)(ppeVar18,local_f8,0);
            peVar17 = (exec_node *)(lVar11 + 8);
            if (lVar11 == 0) {
              peVar17 = (exec_node *)0x0;
            }
            peVar17->next = &local_a0.tail_sentinel;
            peVar17->prev = local_a0.tail_sentinel.prev;
            (local_a0.tail_sentinel.prev)->next = peVar17;
            local_a0.tail_sentinel.prev = peVar17;
          }
          iVar8 = (*(ir->return_deref->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
                    _vptr_ir_instruction[4])(ir->return_deref,pvVar12,0);
          this_03 = (ir_call *)exec_node::operator_new(0x60,pvVar12);
          ir_call::ir_call(this_03,this_01,
                           (ir_dereference_variable *)CONCAT44(extraout_var_01,iVar8),&local_a0);
          if (this_03 != ir) {
            this->progress = true;
            piVar5 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
                     super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir;
            peVar16 = &(this_03->super_ir_instruction).super_exec_node;
            peVar17 = (piVar5->super_exec_node).prev;
            (this_03->super_ir_instruction).super_exec_node.prev = peVar17;
            (this_03->super_ir_instruction).super_exec_node.next = (piVar5->super_exec_node).next;
            peVar17->next = peVar16;
            ((piVar5->super_exec_node).next)->prev = peVar16;
            return visit_continue_with_parent;
          }
          goto LAB_00178baf;
        }
      }
      __assert_fail("deref->type->is_scalar() && (deref->type->is_integer_32() || deref->type->is_float())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                    ,0x3ce,
                    "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                   );
    }
  }
LAB_00178baf:
  iVar10 = ir_rvalue_base_visitor::rvalue_visit((ir_rvalue_base_visitor *)this,ir);
  return iVar10;
}

Assistant:

ir_visitor_status
lower_ubo_reference_visitor::visit_enter(ir_call *ir)
{
   ir_call *new_ir = check_for_ssbo_atomic_intrinsic(ir);
   if (new_ir != ir) {
      progress = true;
      base_ir->replace_with(new_ir);
      return visit_continue_with_parent;
   }

   return rvalue_visit(ir);
}